

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall Generator::generatePluginMetaData(Generator *this)

{
  ClassDef *pCVar1;
  FILE *__stream;
  long n;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QByteArrayView needle_00;
  QByteArrayView haystack;
  QByteArrayView haystack_00;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->cdef;
  if ((pCVar1->pluginData).iid.d.size != 0) {
    needle.m_data = "::";
    needle.m_size = 2;
    haystack.m_data = (pCVar1->super_BaseDef).qualified.d.ptr;
    haystack.m_size = (pCVar1->super_BaseDef).qualified.d.size;
    for (n = QtPrivate::findByteArray(haystack,0,needle); n != -1;
        n = QtPrivate::findByteArray(haystack_00,n + 2,needle_00)) {
      __stream = (FILE *)this->out;
      QByteArray::left(&local_50,&(pCVar1->super_BaseDef).qualified,n);
      pcVar3 = local_50.d.ptr;
      if (local_50.d.ptr == (char *)0x0) {
        pcVar3 = "";
      }
      fprintf(__stream,"using namespace %s;\n",pcVar3);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
        }
      }
      pCVar1 = this->cdef;
      needle_00.m_data = "::";
      needle_00.m_size = 2;
      haystack_00.m_data = (pCVar1->super_BaseDef).qualified.d.ptr;
      haystack_00.m_size = (pCVar1->super_BaseDef).qualified.d.size;
    }
    fputs("\n#ifdef QT_MOC_EXPORT_PLUGIN_V2",(FILE *)this->out);
    pcVar3 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    fprintf((FILE *)this->out,"\nstatic constexpr unsigned char qt_pluginMetaDataV2_%s[] = {",pcVar3
           );
    generatePluginMetaData::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
    pcVar3 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    pcVar2 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    fprintf((FILE *)this->out,"\n};\nQT_MOC_EXPORT_PLUGIN_V2(%s, %s, qt_pluginMetaDataV2_%s)\n",
            pcVar3,pcVar2,pcVar2);
    pcVar3 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    fprintf((FILE *)this->out,
            "#else\nQT_PLUGIN_METADATA_SECTION\nQ_CONSTINIT static constexpr unsigned char qt_pluginMetaData_%s[] = {\n    \'Q\', \'T\', \'M\', \'E\', \'T\', \'A\', \'D\', \'A\', \'T\', \'A\', \' \', \'!\',\n    // metadata version, Qt version, architectural requirements\n    0, QT_VERSION_MAJOR, QT_VERSION_MINOR, qPluginArchRequirements(),"
            ,pcVar3);
    generatePluginMetaData::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
    pcVar3 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    pcVar2 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    fprintf((FILE *)this->out,
            "\n};\nQT_MOC_EXPORT_PLUGIN(%s, %s)\n#endif  // QT_MOC_EXPORT_PLUGIN_V2\n",pcVar3,pcVar2
           );
    fputs("\n",(FILE *)this->out);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generatePluginMetaData()
{
    if (cdef->pluginData.iid.isEmpty())
        return;

    auto outputCborData = [this]() {
        CborDevice dev(out);
        CborEncoder enc;
        cbor_encoder_init_writer(&enc, CborDevice::callback, &dev);

        CborEncoder map;
        cbor_encoder_create_map(&enc, &map, CborIndefiniteLength);

        dev.nextItem("\"IID\"");
        cbor_encode_int(&map, int(QtPluginMetaDataKeys::IID));
        cbor_encode_text_string(&map, cdef->pluginData.iid.constData(), cdef->pluginData.iid.size());

        dev.nextItem("\"className\"");
        cbor_encode_int(&map, int(QtPluginMetaDataKeys::ClassName));
        cbor_encode_text_string(&map, cdef->classname.constData(), cdef->classname.size());

        QJsonObject o = cdef->pluginData.metaData.object();
        if (!o.isEmpty()) {
            dev.nextItem("\"MetaData\"");
            cbor_encode_int(&map, int(QtPluginMetaDataKeys::MetaData));
            jsonObjectToCbor(&map, o);
        }

        if (!cdef->pluginData.uri.isEmpty()) {
            dev.nextItem("\"URI\"");
            cbor_encode_int(&map, int(QtPluginMetaDataKeys::URI));
            cbor_encode_text_string(&map, cdef->pluginData.uri.constData(), cdef->pluginData.uri.size());
        }

        // Add -M args from the command line:
        for (auto it = cdef->pluginData.metaArgs.cbegin(), end = cdef->pluginData.metaArgs.cend(); it != end; ++it) {
            const QJsonArray &a = it.value();
            QByteArray key = it.key().toUtf8();
            dev.nextItem(QByteArray("command-line \"" + key + "\"").constData());
            cbor_encode_text_string(&map, key.constData(), key.size());
            jsonArrayToCbor(&map, a);
        }

        // Close the CBOR map manually
        dev.nextItem();
        cbor_encoder_close_container(&enc, &map);
    };

    // 'Use' all namespaces.
    qsizetype pos = cdef->qualified.indexOf("::");
    for ( ; pos != -1 ; pos = cdef->qualified.indexOf("::", pos + 2) )
        fprintf(out, "using namespace %s;\n", cdef->qualified.left(pos).constData());

    fputs("\n#ifdef QT_MOC_EXPORT_PLUGIN_V2", out);

    // Qt 6.3+ output
    fprintf(out, "\nstatic constexpr unsigned char qt_pluginMetaDataV2_%s[] = {",
          cdef->classname.constData());
    outputCborData();
    fprintf(out, "\n};\nQT_MOC_EXPORT_PLUGIN_V2(%s, %s, qt_pluginMetaDataV2_%s)\n",
            cdef->qualified.constData(), cdef->classname.constData(), cdef->classname.constData());

    // compatibility with Qt 6.0-6.2
    fprintf(out, "#else\nQT_PLUGIN_METADATA_SECTION\n"
          "Q_CONSTINIT static constexpr unsigned char qt_pluginMetaData_%s[] = {\n"
          "    'Q', 'T', 'M', 'E', 'T', 'A', 'D', 'A', 'T', 'A', ' ', '!',\n"
          "    // metadata version, Qt version, architectural requirements\n"
          "    0, QT_VERSION_MAJOR, QT_VERSION_MINOR, qPluginArchRequirements(),",
          cdef->classname.constData());
    outputCborData();
    fprintf(out, "\n};\nQT_MOC_EXPORT_PLUGIN(%s, %s)\n"
                 "#endif  // QT_MOC_EXPORT_PLUGIN_V2\n",
            cdef->qualified.constData(), cdef->classname.constData());

    fputs("\n", out);
}